

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O3

int Gia_ManAppendXorReal(Gia_Man_t *p,int iLit0,int iLit1)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  pGVar4 = Gia_ManAppendObj(p);
  if (iLit0 < 0) {
LAB_00770633:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf2,"int Abc_Lit2Var(int)");
  }
  uVar7 = (uint)iLit0 >> 1;
  uVar1 = p->nObjs;
  if ((int)uVar1 <= (int)uVar7) {
    __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2ac,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
  }
  if (iLit1 < 0) goto LAB_00770633;
  uVar5 = (uint)iLit1 >> 1;
  if (uVar1 <= uVar5) {
    __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2ad,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
  }
  if (uVar7 == uVar5) {
    __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2ae,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
  }
  if ((iLit0 & 1U) != 0) {
    __assert_fail("!Abc_LitIsCompl(iLit0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2af,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
  }
  if ((iLit1 & 1U) != 0) {
    __assert_fail("!Abc_LitIsCompl(iLit1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x2b0,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
  }
  pGVar2 = p->pObjs;
  iVar3 = (int)pGVar4;
  if (uVar5 < uVar7) {
    if (pGVar2 + uVar1 <= pGVar4 || pGVar4 < pGVar2) goto LAB_00770614;
    uVar8 = *(ulong *)pGVar4 & 0xffffffffc0000000 |
            (ulong)(((uint)(iVar3 - (int)pGVar2) >> 2) * -0x55555555 - uVar7 & 0x1fffffff);
    *(ulong *)pGVar4 = uVar8;
    pGVar2 = p->pObjs;
    if ((pGVar4 < pGVar2) || (pGVar2 + p->nObjs <= pGVar4)) goto LAB_00770614;
    uVar9 = (ulong)(((uint)(iVar3 - (int)pGVar2) >> 2) * -0x55555555 - uVar5 & 0x1fffffff) << 0x20;
    uVar6 = 0xe0000000dfffffff;
  }
  else {
    if (pGVar2 + uVar1 <= pGVar4 || pGVar4 < pGVar2) goto LAB_00770614;
    uVar8 = *(ulong *)pGVar4 & 0xc0000000ffffffff |
            (ulong)(((uint)(iVar3 - (int)pGVar2) >> 2) * -0x55555555 - uVar7 & 0x1fffffff) << 0x20;
    *(ulong *)pGVar4 = uVar8;
    pGVar2 = p->pObjs;
    if ((pGVar4 < pGVar2) || (pGVar2 + p->nObjs <= pGVar4)) goto LAB_00770614;
    uVar9 = (ulong)(((uint)(iVar3 - (int)pGVar2) >> 2) * -0x55555555 - uVar5 & 0x1fffffff);
    uVar6 = 0xdfffffffe0000000;
  }
  *(ulong *)pGVar4 = uVar8 & uVar6 & 0xdfffffffdfffffff | uVar9;
  p->nXors = p->nXors + 1;
  pGVar2 = p->pObjs;
  if ((pGVar2 <= pGVar4) && (pGVar4 < pGVar2 + p->nObjs)) {
    return (int)((ulong)((long)pGVar4 - (long)pGVar2) >> 2) * 0x55555556;
  }
LAB_00770614:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline int Gia_ManAppendXorReal( Gia_Man_t * p, int iLit0, int iLit1 )  
{ 
    Gia_Obj_t * pObj = Gia_ManAppendObj( p );
    assert( iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p) );
    assert( iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p) );
    assert( Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1) );
    assert( !Abc_LitIsCompl(iLit0) );
    assert( !Abc_LitIsCompl(iLit1) );
    if ( Abc_Lit2Var(iLit0) > Abc_Lit2Var(iLit1) )
    {
        pObj->iDiff0  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0);
        pObj->fCompl0 = Abc_LitIsCompl(iLit0);
        pObj->iDiff1  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit1);
        pObj->fCompl1 = Abc_LitIsCompl(iLit1);
    }
    else
    {
        pObj->iDiff1  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0);
        pObj->fCompl1 = Abc_LitIsCompl(iLit0);
        pObj->iDiff0  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit1);
        pObj->fCompl0 = Abc_LitIsCompl(iLit1);
    }
    p->nXors++;
    return Gia_ObjId( p, pObj ) << 1;
}